

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O0

void nghttp2_pq_remove(nghttp2_pq *pq,nghttp2_pq_entry *item)

{
  int iVar1;
  nghttp2_pq_entry *item_local;
  nghttp2_pq *pq_local;
  
  if (pq->q[item->index] == item) {
    if (item->index == 0) {
      nghttp2_pq_pop(pq);
    }
    else if (item->index == pq->length - 1) {
      pq->length = pq->length - 1;
    }
    else {
      pq->q[item->index] = pq->q[pq->length - 1];
      pq->q[item->index]->index = item->index;
      pq->length = pq->length - 1;
      iVar1 = (*pq->less)(item,pq->q[item->index]);
      if (iVar1 == 0) {
        bubble_up(pq,item->index);
      }
      else {
        bubble_down(pq,item->index);
      }
    }
    return;
  }
  __assert_fail("pq->q[item->index] == item",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_pq.c"
                ,0x80,"void nghttp2_pq_remove(nghttp2_pq *, nghttp2_pq_entry *)");
}

Assistant:

void nghttp2_pq_remove(nghttp2_pq *pq, nghttp2_pq_entry *item) {
  assert(pq->q[item->index] == item);

  if (item->index == 0) {
    nghttp2_pq_pop(pq);
    return;
  }

  if (item->index == pq->length - 1) {
    --pq->length;
    return;
  }

  pq->q[item->index] = pq->q[pq->length - 1];
  pq->q[item->index]->index = item->index;
  --pq->length;

  if (pq->less(item, pq->q[item->index])) {
    bubble_down(pq, item->index);
  } else {
    bubble_up(pq, item->index);
  }
}